

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysermodel.cpp
# Opt level: O3

bool __thiscall libcellml::AnalyserModel::needMaxFunction(AnalyserModel *this)

{
  Type TVar1;
  undefined1 uVar2;
  
  TVar1 = this->mPimpl->mType;
  uVar2 = 0;
  if ((TVar1 < OVERCONSTRAINED) && (uVar2 = 0, (0x36U >> (TVar1 & 0x1f) & 1) != 0)) {
    uVar2 = this->mPimpl->mNeedMaxFunction;
  }
  return (bool)uVar2;
}

Assistant:

bool AnalyserModel::isValid() const
{
    switch (mPimpl->mType) {
    case AnalyserModel::Type::ODE:
    case AnalyserModel::Type::DAE:
    case AnalyserModel::Type::NLA:
    case AnalyserModel::Type::ALGEBRAIC:
        return true;
    default:
        return false;
    }
}